

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-filenames.c
# Opt level: O0

greatest_test_res filenames_with_trailing_slash(void)

{
  int iVar1;
  greatest_type_info *type_info;
  char *filepath;
  
  make_filepath((char **)&type_info,dirname_slash,filename);
  greatest_info.assertions = greatest_info.assertions + 1;
  iVar1 = greatest_do_assert_equal_t(expected,type_info,&greatest_type_info_string,(void *)0x0);
  if (iVar1 == 0) {
    if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-filenames.c"
      ;
      greatest_info.fail_line = 0x21;
      greatest_info.msg = "type_info->equal callback missing!";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      filepath._4_4_ = GREATEST_TEST_RES_FAIL;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-filenames.c"
      ;
      greatest_info.fail_line = 0x21;
      greatest_info.msg = "expected != filepath";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      filepath._4_4_ = GREATEST_TEST_RES_FAIL;
    }
  }
  else {
    if (type_info != (greatest_type_info *)0x0) {
      free(type_info);
    }
    greatest_info.msg = (char *)0x0;
    filepath._4_4_ = GREATEST_TEST_RES_PASS;
  }
  return filepath._4_4_;
}

Assistant:

TEST filenames_with_trailing_slash(void) {
    char *filepath;
    make_filepath(&filepath, dirname_slash, filename);
    ASSERT_STR_EQ(expected, filepath);
    if (filepath)
        free(filepath);
    PASS();
}